

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.hpp
# Opt level: O3

void __thiscall
beast::unit_test::suite::log_buf<char,_std::char_traits<char>,_std::allocator<char>_>::~log_buf
          (log_buf<char,_std::char_traits<char>,_std::allocator<char>_> *this)

{
  ~log_buf(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~log_buf()
        {
            sync();
        }